

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O0

int bhitpile(obj *obj,_func_int_obj_ptr_obj_ptr *fhito,int tx,int ty)

{
  obj *poVar1;
  int iVar2;
  trap *trap;
  monst *pmVar3;
  trap *t;
  obj *next_obj;
  obj *otmp;
  int hitanything;
  int ty_local;
  int tx_local;
  _func_int_obj_ptr_obj_ptr *fhito_local;
  obj *obj_local;
  
  otmp._4_4_ = 0;
  if ((((obj->otyp == 0x187) || (obj->otyp == 0x1c4)) &&
      (trap = t_at(level,tx,ty), trap != (trap *)0x0)) &&
     ((((trap->field_0x8 & 0x1f) == 0x14 &&
       (pmVar3 = activate_statue_trap(trap,(xchar)tx,(xchar)ty,'\x01'), pmVar3 != (monst *)0x0)) &&
      (obj->otyp == 0x1c4)))) {
    discover_object((int)obj->otyp,'\x01','\x01');
  }
  poly_zapped = -1;
  next_obj = level->objects[tx][ty];
  while (next_obj != (obj *)0x0) {
    poVar1 = (next_obj->v).v_nexthere;
    iVar2 = (*fhito)(next_obj,obj);
    otmp._4_4_ = iVar2 + otmp._4_4_;
    next_obj = poVar1;
  }
  if (-1 < poly_zapped) {
    create_polymon(level->objects[tx][ty],poly_zapped);
  }
  return otmp._4_4_;
}

Assistant:

int bhitpile(struct obj *obj, int (*fhito)(struct obj*,struct obj*),
	     int tx, int ty)
{
    int hitanything = 0;
    struct obj *otmp, *next_obj;

    if (obj->otyp == SPE_FORCE_BOLT || obj->otyp == WAN_STRIKING) {
	struct trap *t = t_at(level, tx, ty);

	/* We can't settle for the default calling sequence of
	   bhito(otmp) -> break_statue(otmp) -> activate_statue_trap(ox,oy)
	   because that last call might end up operating on our `next_obj'
	   (below), rather than on the current object, if it happens to
	   encounter a statue which mustn't become animated. */
	if (t && t->ttyp == STATUE_TRAP &&
	    activate_statue_trap(t, tx, ty, TRUE) && obj->otyp == WAN_STRIKING)
	    makeknown(obj->otyp);
    }

    poly_zapped = -1;
    for (otmp = level->objects[tx][ty]; otmp; otmp = next_obj) {
	/* Fix for polymorph bug, Tim Wright */
	next_obj = otmp->nexthere;
	hitanything += (*fhito)(otmp, obj);
    }
    if (poly_zapped >= 0)
	create_polymon(level->objects[tx][ty], poly_zapped);

    return hitanything;
}